

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O3

int xattr_new(archive_read *a,xar *xar,xmlattr_list *list)

{
  char *pcVar1;
  xattr *pxVar2;
  int iVar3;
  xattr *pxVar4;
  size_t sVar5;
  xattr *pxVar6;
  ulong uVar7;
  uint uVar8;
  size_t sVar9;
  xmlattr *pxVar10;
  bool bVar11;
  
  pxVar4 = (xattr *)calloc(1,0xb0);
  if (pxVar4 == (xattr *)0x0) {
    archive_set_error(&a->archive,0xc,"Out of memory");
    iVar3 = -0x1e;
  }
  else {
    xar->xattr = pxVar4;
    uVar7 = 0;
    for (pxVar10 = list->first; pxVar10 != (xmlattr *)0x0; pxVar10 = pxVar10->next) {
      pcVar1 = pxVar10->name;
      if (((*pcVar1 == 'i') && (pcVar1[1] == 'd')) && (pcVar1[2] == '\0')) {
        pcVar1 = pxVar10->value;
        sVar5 = strlen(pcVar1);
        if ((sVar5 == 0) || (uVar8 = (int)*pcVar1 - 0x30, 9 < uVar8)) {
          uVar7 = 0;
        }
        else {
          uVar7 = 0;
          sVar9 = 1;
          do {
            uVar7 = (ulong)uVar8 + uVar7 * 10;
            uVar8 = (int)pcVar1[sVar9] - 0x30;
            if (9 < uVar8) break;
            bVar11 = sVar5 != sVar9;
            sVar9 = sVar9 + 1;
          } while (bVar11);
        }
        pxVar4->id = uVar7;
      }
    }
    pxVar2 = (xattr *)&xar->file->xattr_list;
    do {
      pxVar6 = pxVar2;
      pxVar2 = pxVar6->next;
      if (pxVar2 == (xattr *)0x0) break;
    } while (pxVar2->id <= uVar7);
    pxVar4->next = pxVar2;
    pxVar6->next = pxVar4;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int
xattr_new(struct archive_read *a, struct xar *xar, struct xmlattr_list *list)
{
	struct xattr *xattr, **nx;
	struct xmlattr *attr;

	xattr = calloc(1, sizeof(*xattr));
	if (xattr == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Out of memory");
		return (ARCHIVE_FATAL);
	}
	xar->xattr = xattr;
	for (attr = list->first; attr != NULL; attr = attr->next) {
		if (strcmp(attr->name, "id") == 0)
			xattr->id = atol10(attr->value, strlen(attr->value));
	}
	/* Chain to xattr list. */
	for (nx = &(xar->file->xattr_list);
	    *nx != NULL; nx = &((*nx)->next)) {
		if (xattr->id < (*nx)->id)
			break;
	}
	xattr->next = *nx;
	*nx = xattr;

	return (ARCHIVE_OK);
}